

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_rate.c
# Opt level: O2

double * inform_local_entropy_rate
                   (int *series,size_t n,size_t m,int b,size_t k,double *er,inform_error *err)

{
  int *piVar1;
  _Bool _Var2;
  ulong uVar3;
  double *__ptr;
  void *__ptr_00;
  size_t sVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  size_t sVar11;
  void *pvVar12;
  int iVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double *local_60;
  
  _Var2 = check_arguments(series,n,m,b,k,err);
  if (_Var2) {
    return (double *)0x0;
  }
  lVar6 = (m - k) * n;
  local_60 = er;
  if ((er != (double *)0x0) || (local_60 = (double *)malloc(lVar6 * 8), local_60 != (double *)0x0))
  {
    auVar15._8_4_ = (int)(k >> 0x20);
    auVar15._0_8_ = k;
    auVar15._12_4_ = 0x45300000;
    dVar14 = pow((double)b,
                 (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar14 = dVar14 * (double)b;
    uVar3 = (ulong)dVar14;
    uVar3 = (long)(dVar14 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    __ptr = (double *)calloc(uVar3 / (ulong)(long)b + uVar3,4);
    if (__ptr == (double *)0x0) {
      __ptr = local_60;
      if (er != (double *)0x0) goto LAB_001040e7;
    }
    else {
      __ptr_00 = malloc(lVar6 * 0x10);
      if (__ptr_00 != (void *)0x0) {
        piVar8 = (int *)((long)__ptr_00 + lVar6 * 4);
        piVar7 = series + k;
        pvVar12 = __ptr_00;
        for (sVar11 = 0; sVar11 != n; sVar11 = sVar11 + 1) {
          *piVar8 = 0;
          iVar9 = 0;
          iVar13 = 1;
          for (sVar4 = 0; k != sVar4; sVar4 = sVar4 + 1) {
            iVar13 = iVar13 * b;
            iVar9 = iVar9 * b + series[sVar4];
            *piVar8 = iVar9;
          }
          for (lVar10 = 0; k + lVar10 < m; lVar10 = lVar10 + 1) {
            lVar5 = (long)piVar7[lVar10] + (long)piVar8[lVar10] * (long)b;
            iVar9 = (int)lVar5;
            *(int *)((long)pvVar12 + lVar10 * 4) = iVar9;
            piVar1 = (int *)((long)__ptr + lVar5 * 4);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)((long)__ptr + (long)piVar8[lVar10] * 4 + uVar3 * 4);
            *piVar1 = *piVar1 + 1;
            if (~k + m != lVar10) {
              piVar8[lVar10 + 1] = iVar9 - series[lVar10] * iVar13;
            }
          }
          piVar8 = piVar8 + (m - k);
          series = series + m;
          piVar7 = piVar7 + m;
          pvVar12 = (void *)((long)pvVar12 + m * 4 + k * -4);
        }
        for (lVar10 = 0; lVar6 != lVar10; lVar10 = lVar10 + 1) {
          dVar14 = log2((double)*(uint *)((long)__ptr +
                                         (long)*(int *)((long)__ptr_00 + lVar10 * 4 + lVar6 * 4) * 4
                                         + uVar3 * 4) /
                        (double)*(uint *)((long)__ptr +
                                         (long)*(int *)((long)__ptr_00 + lVar10 * 4) * 4));
          local_60[lVar10] = dVar14;
        }
        free(__ptr_00);
        free(__ptr);
        return local_60;
      }
      if (er == (double *)0x0) {
        free(local_60);
      }
    }
    free(__ptr);
  }
LAB_001040e7:
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_entropy_rate(int const *series, size_t n, size_t m, int b,
    size_t k, double *er, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate_er = (er == NULL);
    if (allocate_er)
    {
        er = malloc(N * sizeof(double));
        if (er == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) (b * pow((double) b, (double) k));
    size_t const histories_size = states_size / b;
    size_t const total_size = states_size + histories_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        if (allocate_er) free(er);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states    = { histogram_data, states_size, N };
    inform_dist histories = { histogram_data + states_size, histories_size, N };


    int *state_data = malloc(2 * N * sizeof(uint64_t));
    if (state_data == NULL)
    {
        if (allocate_er) free(er);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state = state_data;
    int *history = state + N;

    accumulate_local_observations(series, n, m, b, k, &states, &histories,
        state, history);

    double s, h;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        h = histories.histogram[history[i]];
        er[i] = log2(h/s);
    }

    free(state_data);
    free(histogram_data);

    return er;
}